

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O0

ostream * Gudhi::skeleton_blocker::operator<<
                    (ostream *o,
                    Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *sigma)

{
  bool bVar1;
  bool bVar2;
  reference pVVar3;
  Vertex_handle local_3c;
  const_iterator cStack_38;
  Vertex_handle i;
  const_iterator __end0;
  const_iterator __begin0;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *__range3;
  bool first;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *sigma_local;
  ostream *o_local;
  
  bVar1 = true;
  std::operator<<(o,"{");
  __end0 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           ::begin(sigma);
  cStack_38 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              ::end(sigma);
  while( true ) {
    bVar2 = std::operator!=(&__end0,&stack0xffffffffffffffc8);
    if (!bVar2) break;
    pVVar3 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&__end0);
    local_3c.vertex = pVVar3->vertex;
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<(o,",");
    }
    operator<<(o,&local_3c);
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::operator++(&__end0);
  }
  std::operator<<(o,"}");
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                                  const Skeleton_blocker_simplex & sigma) {
    bool first = true;
    o << "{";
    for (auto i : sigma) {
      if (first)
        first = false;
      else
        o << ",";
      o << i;
    }
    o << "}";
    return o;
  }